

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crl.c
# Opt level: O3

int x509_get_crl_ext(uchar **p,uchar *end,mbedtls_x509_buf *ext)

{
  uchar *puVar1;
  int iVar2;
  int iVar3;
  uchar *end_00;
  int is_critical;
  size_t len;
  int local_3c;
  size_t local_38;
  
  iVar2 = mbedtls_x509_get_ext(p,end,ext,0);
  iVar3 = 0;
  if ((iVar2 != -0x62) && (iVar3 = iVar2, iVar2 == 0)) {
    end_00 = *p;
    do {
      if (end <= end_00) {
        if (end_00 != end) {
          return -0x2566;
        }
        return 0;
      }
      local_3c = 0;
      iVar3 = mbedtls_asn1_get_tag(p,end,&local_38,0x30);
      if (iVar3 != 0) {
LAB_0010cdc6:
        return iVar3 + -0x2500;
      }
      end_00 = *p + local_38;
      iVar3 = mbedtls_asn1_get_tag(p,end_00,&local_38,6);
      if (iVar3 != 0) goto LAB_0010cdc6;
      *p = *p + local_38;
      iVar3 = mbedtls_asn1_get_bool(p,end_00,&local_3c);
      if (((iVar3 != -0x62) && (iVar3 != 0)) ||
         (iVar3 = mbedtls_asn1_get_tag(p,end_00,&local_38,4), iVar3 != 0)) goto LAB_0010cdc6;
      puVar1 = *p;
      *p = puVar1 + local_38;
      if (puVar1 + local_38 != end_00) {
        return -0x2566;
      }
    } while (local_3c == 0);
    iVar3 = -0x2562;
  }
  return iVar3;
}

Assistant:

static int x509_get_crl_ext( unsigned char **p,
                             const unsigned char *end,
                             mbedtls_x509_buf *ext )
{
    int ret;

    /*
     * crlExtensions           [0]  EXPLICIT Extensions OPTIONAL
     *                              -- if present, version MUST be v2
     */
    if( ( ret = mbedtls_x509_get_ext( p, end, ext, 0 ) ) != 0 )
    {
        if( ret == MBEDTLS_ERR_ASN1_UNEXPECTED_TAG )
            return( 0 );

        return( ret );
    }

    while( *p < end )
    {
        /*
         * Extension  ::=  SEQUENCE  {
         *      extnID      OBJECT IDENTIFIER,
         *      critical    BOOLEAN DEFAULT FALSE,
         *      extnValue   OCTET STRING  }
         */
        int is_critical = 0;
        const unsigned char *end_ext_data;
        size_t len;

        /* Get enclosing sequence tag */
        if( ( ret = mbedtls_asn1_get_tag( p, end, &len,
                MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE ) ) != 0 )
            return( MBEDTLS_ERR_X509_INVALID_EXTENSIONS + ret );

        end_ext_data = *p + len;

        /* Get OID (currently ignored) */
        if( ( ret = mbedtls_asn1_get_tag( p, end_ext_data, &len,
                                          MBEDTLS_ASN1_OID ) ) != 0 )
        {
            return( MBEDTLS_ERR_X509_INVALID_EXTENSIONS + ret );
        }
        *p += len;

        /* Get optional critical */
        if( ( ret = mbedtls_asn1_get_bool( p, end_ext_data,
                                           &is_critical ) ) != 0 &&
            ( ret != MBEDTLS_ERR_ASN1_UNEXPECTED_TAG ) )
        {
            return( MBEDTLS_ERR_X509_INVALID_EXTENSIONS + ret );
        }

        /* Data should be octet string type */
        if( ( ret = mbedtls_asn1_get_tag( p, end_ext_data, &len,
                MBEDTLS_ASN1_OCTET_STRING ) ) != 0 )
            return( MBEDTLS_ERR_X509_INVALID_EXTENSIONS + ret );

        /* Ignore data so far and just check its length */
        *p += len;
        if( *p != end_ext_data )
            return( MBEDTLS_ERR_X509_INVALID_EXTENSIONS +
                    MBEDTLS_ERR_ASN1_LENGTH_MISMATCH );

        /* Abort on (unsupported) critical extensions */
        if( is_critical )
            return( MBEDTLS_ERR_X509_INVALID_EXTENSIONS +
                    MBEDTLS_ERR_ASN1_UNEXPECTED_TAG );
    }

    if( *p != end )
        return( MBEDTLS_ERR_X509_INVALID_EXTENSIONS +
                MBEDTLS_ERR_ASN1_LENGTH_MISMATCH );

    return( 0 );
}